

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

void __thiscall MessageQueue::~MessageQueue(MessageQueue *this)

{
  MessageThread *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this_00 = (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (MessageThread *)0x0) {
    MessageThread::stop(this_00);
    Thread::join(&((this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_Thread);
    p_Var1 = (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  if ((this->queue != -1) && (this->owner == true)) {
    msgctl(this->queue,0,(msqid_ds *)0x0);
  }
  p_Var1 = (this->thread).super___shared_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_Buffer_&)>_>_>_>
  ::~_Rb_tree(&(this->signalDataAvailable).connections._M_t);
  return;
}

Assistant:

MessageQueue::~MessageQueue()
{
    if (thread) {
        thread->stop();
        thread->join();
        thread.reset();
    }
    if (queue != -1 && owner) {
        msgctl(queue, IPC_RMID, 0);
    }
}